

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_convolve_y_sr_c(uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
                        InterpFilterParams *filter_params_y,int subpel_y_qn)

{
  ushort uVar1;
  uint8_t uVar2;
  int16_t *piVar3;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int k;
  int32_t res;
  int x;
  int y;
  int16_t *y_filter;
  int fo_vert;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  uVar1 = _k->taps;
  piVar3 = av1_get_interp_filter_subpel_kernel(_k,x & 0xf);
  for (local_34 = 0; local_34 < in_R9D; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < in_R8D; local_38 = local_38 + 1) {
      local_3c = 0;
      for (local_40 = 0; local_40 < (int)(uint)_k->taps; local_40 = local_40 + 1) {
        local_3c = (int)piVar3[local_40] *
                   (uint)*(byte *)(in_RDI + (int)(((local_34 - (uVar1 / 2 - 1)) + local_40) * in_ESI
                                                 + local_38)) + local_3c;
      }
      uVar2 = clip_pixel(local_3c + 0x40 >> 7);
      *(uint8_t *)(in_RDX + (local_34 * in_ECX + local_38)) = uVar2;
    }
  }
  return;
}

Assistant:

void av1_convolve_y_sr_c(const uint8_t *src, int src_stride, uint8_t *dst,
                         int dst_stride, int w, int h,
                         const InterpFilterParams *filter_params_y,
                         const int subpel_y_qn) {
  const int fo_vert = filter_params_y->taps / 2 - 1;

  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      dst[y * dst_stride + x] =
          clip_pixel(ROUND_POWER_OF_TWO(res, FILTER_BITS));
    }
  }
}